

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_block_decoder.c
# Opt level: O0

pt_block_decoder * pt_blk_alloc_decoder(pt_config *config)

{
  int iVar1;
  int errcode;
  pt_block_decoder *decoder;
  pt_config *config_local;
  
  config_local = (pt_config *)malloc(0xa78);
  if ((pt_block_decoder *)config_local == (pt_block_decoder *)0x0) {
    config_local = (pt_config *)0x0;
  }
  else {
    iVar1 = pt_blk_decoder_init((pt_block_decoder *)config_local,config);
    if (iVar1 < 0) {
      free(config_local);
      config_local = (pt_config *)0x0;
    }
  }
  return (pt_block_decoder *)config_local;
}

Assistant:

struct pt_block_decoder *
pt_blk_alloc_decoder(const struct pt_config *config)
{
	struct pt_block_decoder *decoder;
	int errcode;

	decoder = malloc(sizeof(*decoder));
	if (!decoder)
		return NULL;

	errcode = pt_blk_decoder_init(decoder, config);
	if (errcode < 0) {
		free(decoder);
		return NULL;
	}

	return decoder;
}